

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

CURLcode get_args(OperationConfig *config,size_t i)

{
  char *pcVar1;
  bool last_00;
  CURLcode local_24;
  _Bool last;
  CURLcode result;
  size_t i_local;
  OperationConfig *config_local;
  
  local_24 = CURLE_OK;
  last_00 = config->next == (OperationConfig *)0x0;
  if ((((config->userpwd == (char *)0x0) || (config->oauth_bearer != (char *)0x0)) ||
      (local_24 = checkpasswd("host",i,last_00,&config->userpwd), config_local._4_4_ = local_24,
      local_24 == CURLE_OK)) &&
     ((config->proxyuserpwd == (char *)0x0 ||
      (local_24 = checkpasswd("proxy",i,last_00,&config->proxyuserpwd),
      config_local._4_4_ = local_24, local_24 == CURLE_OK)))) {
    if (config->useragent == (char *)0x0) {
      pcVar1 = my_useragent();
      config->useragent = pcVar1;
      if (config->useragent == (char *)0x0) {
        helpf(config->global->errors,"out of memory\n");
        local_24 = CURLE_OUT_OF_MEMORY;
      }
    }
    config_local._4_4_ = local_24;
  }
  return config_local._4_4_;
}

Assistant:

CURLcode get_args(struct OperationConfig *config, const size_t i)
{
  CURLcode result = CURLE_OK;
  bool last = (config->next ? FALSE : TRUE);

  /* Check we have a password for the given host user */
  if(config->userpwd && !config->oauth_bearer) {
    result = checkpasswd("host", i, last, &config->userpwd);
    if(result)
      return result;
  }

  /* Check we have a password for the given proxy user */
  if(config->proxyuserpwd) {
    result = checkpasswd("proxy", i, last, &config->proxyuserpwd);
    if(result)
      return result;
  }

  /* Check we have a user agent */
  if(!config->useragent) {
    config->useragent = my_useragent();
    if(!config->useragent) {
      helpf(config->global->errors, "out of memory\n");
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  return result;
}